

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::InputFile::Data::bufferedReadPixels(Data *this,int scanLine1,int scanLine2)

{
  TiledInputFile *pTVar1;
  FrameBuffer *this_00;
  int yStart;
  uint uVar2;
  int iVar3;
  int iVar4;
  Iterator IVar5;
  iterator iVar6;
  iterator iVar7;
  ArgExc *this_01;
  Data *this_02;
  int width;
  int scanline2;
  int dy1;
  ulong uVar8;
  exr_attr_box2i_t eVar9;
  Box2i tileRange;
  int local_60;
  int local_3c;
  int local_34;
  
  if (this->_part == (InputPartData *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = this->_part->partNumber;
  }
  eVar9 = Context::dataWindow(this->_ctxt,iVar3);
  iVar3 = scanLine2;
  if (scanLine2 < scanLine1) {
    iVar3 = scanLine1;
    scanLine1 = scanLine2;
  }
  yStart = eVar9.min.y;
  if ((scanLine1 < yStart) || (eVar9.max.y < iVar3)) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc
              (this_01,"Tried to read scan line outside the image file\'s data window.");
    __cxa_throw(this_01,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  uVar2 = TiledInputFile::tileYSize
                    ((this->_tFile)._M_t.
                     super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
                     .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl);
  uVar8 = (ulong)(uint)(scanLine1 - yStart) / (ulong)uVar2;
  uVar2 = TiledInputFile::tileYSize
                    ((this->_tFile)._M_t.
                     super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
                     .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl);
  uVar2 = (uint)(iVar3 - yStart) / uVar2;
  pTVar1 = (this->_tFile)._M_t.
           super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
           ._M_t.
           super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
           .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl;
  if (eVar9.max.y == iVar3 && scanLine1 == yStart) {
    TiledInputFile::setFrameBuffer(pTVar1,&this->_cacheFrameBuffer);
    pTVar1 = (this->_tFile)._M_t.
             super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
             ._M_t.
             super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
             .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl;
    iVar3 = TiledInputFile::numXTiles(pTVar1,0);
    TiledInputFile::readTiles(pTVar1,0,iVar3 + -1,(int)uVar8,uVar2,0,0);
  }
  else {
    TiledInputFile::setFrameBuffer
              (pTVar1,(this->_cachedBuffer)._M_t.
                      super___uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Imf_3_4::FrameBuffer_*,_std::default_delete<Imf_3_4::FrameBuffer>_>
                      .super__Head_base<0UL,_Imf_3_4::FrameBuffer_*,_false>._M_head_impl);
    if ((int)uVar8 <= (int)uVar2) {
      local_60 = eVar9.min.x;
      width = (eVar9.max.x - local_60) + 1;
      do {
        dy1 = (int)uVar8;
        if (dy1 != this->_cachedTileY) {
          this_00 = (this->_cachedBuffer)._M_t.
                    super___uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Imf_3_4::FrameBuffer_*,_std::default_delete<Imf_3_4::FrameBuffer>_>
                    .super__Head_base<0UL,_Imf_3_4::FrameBuffer_*,_false>._M_head_impl;
          if (this_00 != (FrameBuffer *)0x0) {
            IVar5 = FrameBuffer::begin(this_00);
            iVar6._M_node =
                 (_Base_ptr)
                 FrameBuffer::end((this->_cachedBuffer)._M_t.
                                  super___uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Imf_3_4::FrameBuffer_*,_std::default_delete<Imf_3_4::FrameBuffer>_>
                                  .super__Head_base<0UL,_Imf_3_4::FrameBuffer_*,_false>._M_head_impl
                                 );
            if (IVar5._i._M_node != (iterator)iVar6._M_node) {
              pTVar1 = (this->_tFile)._M_t.
                       super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
                       .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl;
              iVar4 = TiledInputFile::numXTiles(pTVar1,0);
              TiledInputFile::readTiles(pTVar1,0,iVar4 + -1,dy1,dy1,0,0);
            }
          }
          this->_cachedTileY = dy1;
        }
        TiledInputFile::dataWindowForTile
                  ((TiledInputFile *)&stack0xffffffffffffffc0,
                   (int)(this->_tFile)._M_t.
                        super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
                        .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl,0,dy1)
        ;
        iVar4 = local_3c;
        if (local_3c < scanLine1) {
          iVar4 = scanLine1;
        }
        scanline2 = local_34;
        if (iVar3 <= local_34) {
          scanline2 = iVar3;
        }
        for (iVar6._M_node = (_Base_ptr)FrameBuffer::begin(&this->_cacheFrameBuffer);
            IVar5 = FrameBuffer::end(&this->_cacheFrameBuffer),
            (iterator)iVar6._M_node != IVar5._i._M_node;
            iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node)) {
          this_02 = (Data *)(this->_cachedBuffer)._M_t.
                            super___uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Imf_3_4::FrameBuffer_*,_std::default_delete<Imf_3_4::FrameBuffer>_>
                            .super__Head_base<0UL,_Imf_3_4::FrameBuffer_*,_false>._M_head_impl;
          if (this_02 == (Data *)0x0) {
LAB_00186ddd:
            fillBuffer(this_02,(ConstIterator)iVar6._M_node,iVar4,scanline2,yStart,local_60,width);
          }
          else {
            IVar5 = FrameBuffer::find((FrameBuffer *)this_02,(char *)(iVar6._M_node + 1));
            this_02 = (Data *)(this->_cachedBuffer)._M_t.
                              super___uniq_ptr_impl<Imf_3_4::FrameBuffer,_std::default_delete<Imf_3_4::FrameBuffer>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Imf_3_4::FrameBuffer_*,_std::default_delete<Imf_3_4::FrameBuffer>_>
                              .super__Head_base<0UL,_Imf_3_4::FrameBuffer_*,_false>._M_head_impl;
            iVar7._M_node = (_Base_ptr)FrameBuffer::end((FrameBuffer *)this_02);
            if (IVar5._i._M_node == (iterator)iVar7._M_node) goto LAB_00186ddd;
            copyCachedBuffer(this_02,(ConstIterator)iVar6._M_node,(ConstIterator)IVar5._i._M_node,
                             iVar4,scanline2,local_3c,local_60,width);
          }
        }
        uVar8 = (ulong)(dy1 + 1);
      } while (dy1 < (int)uVar2);
    }
  }
  return;
}

Assistant:

void
InputFile::Data::bufferedReadPixels (int scanLine1, int scanLine2)
{
    exr_attr_box2i_t dataWindow = _ctxt->dataWindow (getPartIdx ());

    //
    // bufferedReadPixels reads each row of tiles that intersect the
    // scan-line range (scanLine1 to scanLine2). The previous row of
    // tiles is cached in order to prevent redundant tile reads when
    // accessing scanlines sequentially.
    //

    int minY = std::min (scanLine1, scanLine2);
    int maxY = std::max (scanLine1, scanLine2);

    if (minY < dataWindow.min.y || maxY > dataWindow.max.y)
    {
        throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
                                     "the image file's data window.");
    }

    int minDy = (minY - dataWindow.min.y) / _tFile->tileYSize ();
    int maxDy = (maxY - dataWindow.min.y) / _tFile->tileYSize ();

    // if we're reading the whole thing, just skip the double copy entirely
    if (minY == dataWindow.min.y && maxY == dataWindow.max.y)
    {
        _tFile->setFrameBuffer (_cacheFrameBuffer);
        _tFile->readTiles (0, _tFile->numXTiles (0) - 1, minDy, maxDy, 0, 0);
        return;
    }

    _tFile->setFrameBuffer (*_cachedBuffer);

    for ( int j = minDy; j <= maxDy; ++j )
    {
        if (j != _cachedTileY)
        {
            //
            // We don't have any valid buffered info, so we need to read in
            // from the file.
            // if no channels are being read that are present in file, cachedBuffer will be empty
            //

            if (_cachedBuffer &&
                _cachedBuffer->begin () != _cachedBuffer->end ())
            {
                _tFile->readTiles (0, _tFile->numXTiles (0) - 1, j, j, 0, 0);
            }

            _cachedTileY = j;
        }

        IMATH_NAMESPACE::Box2i tileRange = _tFile->dataWindowForTile (0, j, 0);

        int minYThisRow = std::max (minY, tileRange.min.y);
        int maxYThisRow = std::min (maxY, tileRange.max.y);

        int xStart = dataWindow.min.x;
        int width = dataWindow.max.x - dataWindow.min.x + 1;

        for (FrameBuffer::ConstIterator k = _cacheFrameBuffer.begin ();
             k != _cacheFrameBuffer.end ();
             ++k)
        {
            if (_cachedBuffer)
            {
                FrameBuffer::ConstIterator c = _cachedBuffer->find (k.name ());
                if (c != _cachedBuffer->end ())
                {
                    copyCachedBuffer (k, c, minYThisRow, maxYThisRow,
                                      tileRange.min.y, xStart, width);
                    continue;
                }
            }
            fillBuffer (k, minYThisRow, maxYThisRow,
                        dataWindow.min.y, xStart, width);
        }
    }
}